

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_details.cxx
# Opt level: O3

void __thiscall read_slot_v2::operator()(read_slot_v2 *this,detail_slot_v3 *ds,xr_reader *r)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  detail_palette *pdVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  detail_slot_v2 ds2;
  undefined8 local_28;
  byte bStack_20;
  undefined2 uStack_1f;
  byte bStack_1d;
  undefined2 uStack_1c;
  byte bStack_1a;
  undefined1 uStack_19;
  undefined1 uStack_18;
  byte bStack_17;
  undefined4 uStack_16;
  
  puVar1 = (r->field_2).m_p;
  uVar2 = *(undefined8 *)(puVar1 + 0xe);
  uStack_18 = (undefined1)((ulong)uVar2 >> 0x10);
  bStack_17 = (byte)((ulong)uVar2 >> 0x18);
  uStack_16 = (undefined4)((ulong)uVar2 >> 0x20);
  local_28 = *(undefined8 *)puVar1;
  uVar2 = *(undefined8 *)(puVar1 + 8);
  uVar3 = local_28;
  bStack_20 = (byte)uVar2;
  uStack_1f = (undefined2)((ulong)uVar2 >> 8);
  bStack_1d = (byte)((ulong)uVar2 >> 0x18);
  uStack_1c = (undefined2)((ulong)uVar2 >> 0x20);
  bStack_1a = (byte)((ulong)uVar2 >> 0x30);
  uStack_19 = (undefined1)((ulong)uVar2 >> 0x38);
  (r->field_2).m_p = puVar1 + 0x16;
  local_28._4_4_ = (float)((ulong)local_28 >> 0x20);
  fVar10 = local_28._4_4_;
  if (local_28._4_4_ <= (float)local_28) {
    uVar5 = 0;
  }
  else {
    fVar9 = (float)local_28 + 200.0;
    local_28 = uVar3;
    fVar9 = floorf(fVar9 * 5.0);
    uVar8 = 0xfff;
    if ((uint)(long)fVar9 < 0xfff) {
      uVar8 = (uint)(long)fVar9;
    }
    fVar10 = ceilf((fVar10 - ((float)(int)uVar8 * 0.2 + -200.0)) * 10.0);
    uVar4 = 0xff;
    if ((uint)(long)fVar10 < 0xff) {
      uVar4 = (uint)(long)fVar10;
    }
    uVar5 = (ulong)(uVar4 << 0xc | uVar8);
  }
  *(ulong *)ds = (ulong)(bStack_1a & 0x3f) << 0x20 |
                 (uint)bStack_1d << 0x1a | uVar5 | (ulong)((bStack_20 & 0x3f) << 0x14) |
                 (ulong)bStack_17 << 0x26 | 0x7700000000000;
  pdVar7 = ds->palette + 3;
  lVar6 = 0x12;
  do {
    *pdVar7 = *(detail_palette *)((long)&local_28 + lVar6);
    lVar6 = lVar6 + -3;
    pdVar7 = pdVar7 + -1;
  } while (lVar6 != 6);
  return;
}

Assistant:

void operator()(detail_slot_v3& ds, xr_reader& r) const {
	detail_slot_v2 ds2;
	r.r(ds2);
	if (ds2.y_top > ds2.y_base) {
		uint32_t y_base = uint32_t(std::floor((ds2.y_base + 200.f)*5.f));
		ds.y_base = y_base > 0xfff ? 0xfff : y_base;
		uint32_t y_height = uint32_t(std::ceil((ds2.y_top - ds.r_ybase())*10.f));
		ds.y_height = y_height > 0xff ? 0xff : y_height;
//xr_assert(ds2.y_base >= -200.f);
//xr_assert(ds.y_height != 0);
//xr_assert(ds.r_ybase() <= ds2.y_base + 0.0001);
//if (y_height <= 0xff)
//	xr_assert(ds.r_ybase() + ds.r_yheight() >= ds2.y_top);
	} else {
		ds.y_base = 0;
		ds.y_height = 0;
	}
	ds.id0 = ds2.part[0].id;
	ds.id1 = ds2.part[1].id;
	ds.id2 = ds2.part[2].id;
	ds.id3 = ds2.part[3].id;
	ds.c_dir = 7;
	ds.c_hemi = 7;
	ds.c_r = 0;
	ds.c_g = 0;
	ds.c_b = 0;
	for (uint_fast32_t i = 4; i != 0;) {
		--i;
		ds.palette[i] = ds2.part[i].palette;
	}
}